

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicHeap.hpp
# Opt level: O0

bool __thiscall
Lib::
DynamicHeap<unsigned_int,_DP::SimpleCongruenceClosure::ConstOrderingComparator,_Lib::ArrayMap<unsigned_int>,_unsigned_int>
::isGreater1(DynamicHeap<unsigned_int,_DP::SimpleCongruenceClosure::ConstOrderingComparator,_Lib::ArrayMap<unsigned_int>,_unsigned_int>
             *this,size_t idxA,size_t idxB)

{
  Comparison CVar1;
  uint unaff_retaddr;
  uint unaff_retaddr_00;
  uint *data1;
  
  getData1((DynamicHeap<unsigned_int,_DP::SimpleCongruenceClosure::ConstOrderingComparator,_Lib::ArrayMap<unsigned_int>,_unsigned_int>
            *)0x2a6d31);
  CVar1 = DP::SimpleCongruenceClosure::ConstOrderingComparator::compare
                    ((ConstOrderingComparator *)data1,unaff_retaddr_00,unaff_retaddr);
  return CVar1 == GREATER;
}

Assistant:

bool isGreater1(size_t idxA, size_t idxB)
  {
    ASS_G(idxA, 0);
    ASS_LE(idxA, size());
    ASS_G(idxB, 0);
    ASS_LE(idxB, size());

    T* data1 = getData1();
    return _cmp.compare(data1[idxA], data1[idxB])==GREATER;
  }